

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O0

void __thiscall discordpp::MessageCreateEvent::MessageCreateEvent(MessageCreateEvent *this,json *j)

{
  omittable_field<discordpp::RoleSubscriptionData> local_398;
  omittable_field<int> local_378;
  omittable_field<std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>_> local_358;
  omittable_field<std::vector<discordpp::StickerItem,_std::allocator<discordpp::StickerItem>_>_>
  local_338;
  omittable_field<std::vector<discordpp::Component,_std::allocator<discordpp::Component>_>_>
  local_318;
  omittable_field<discordpp::Channel> local_2f8;
  omittable_field<discordpp::MessageInteraction> local_2d8;
  nullable_omittable_field<discordpp::Message> local_2b8;
  omittable_field<int> local_298;
  omittable_field<discordpp::MessageReference> local_278;
  omittable_field<discordpp::Snowflake> local_258;
  omittable_field<discordpp::Application> local_238;
  omittable_field<discordpp::MessageActivity> local_218;
  field<int> local_1f8;
  omittable_field<discordpp::Snowflake> local_1e0;
  field<bool> local_1c0;
  omittable_field<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a8;
  omittable_field<std::vector<discordpp::Reaction,_std::allocator<discordpp::Reaction>_>_> local_188
  ;
  field<std::vector<discordpp::Embed,_std::allocator<discordpp::Embed>_>_> local_168;
  field<std::vector<discordpp::Attachment,_std::allocator<discordpp::Attachment>_>_> local_150;
  omittable_field<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_>
  local_138;
  field<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_> local_118;
  field<std::vector<discordpp::User,_std::allocator<discordpp::User>_>_> local_100;
  field<bool> local_e8;
  field<bool> local_d0;
  nullable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_98;
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_80;
  field<discordpp::User> local_68 [2];
  field<discordpp::Snowflake> local_40;
  field<discordpp::Snowflake> local_28;
  json *local_18;
  json *j_local;
  MessageCreateEvent *this_local;
  
  local_18 = j;
  j_local = (json *)this;
  field<discordpp::Snowflake>::field(&local_28);
  field<discordpp::Snowflake>::field(&local_40);
  field<discordpp::User>::field(local_68);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&local_80);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&local_98);
  nullable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  nullable_field(&local_b8);
  field<bool>::field(&local_d0);
  field<bool>::field(&local_e8);
  field<std::vector<discordpp::User,_std::allocator<discordpp::User>_>_>::field(&local_100);
  field<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_>::field
            (&local_118);
  omittable_field<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_>
  ::omittable_field(&local_138);
  field<std::vector<discordpp::Attachment,_std::allocator<discordpp::Attachment>_>_>::field
            (&local_150);
  field<std::vector<discordpp::Embed,_std::allocator<discordpp::Embed>_>_>::field(&local_168);
  omittable_field<std::vector<discordpp::Reaction,_std::allocator<discordpp::Reaction>_>_>::
  omittable_field(&local_188);
  omittable_field<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::omittable_field(&local_1a8);
  field<bool>::field(&local_1c0);
  omittable_field<discordpp::Snowflake>::omittable_field(&local_1e0);
  field<int>::field(&local_1f8);
  omittable_field<discordpp::MessageActivity>::omittable_field(&local_218);
  omittable_field<discordpp::Application>::omittable_field(&local_238);
  omittable_field<discordpp::Snowflake>::omittable_field(&local_258);
  omittable_field<discordpp::MessageReference>::omittable_field(&local_278);
  omittable_field<int>::omittable_field(&local_298);
  nullable_omittable_field<discordpp::Message>::nullable_omittable_field(&local_2b8);
  omittable_field<discordpp::MessageInteraction>::omittable_field(&local_2d8);
  omittable_field<discordpp::Channel>::omittable_field(&local_2f8);
  omittable_field<std::vector<discordpp::Component,_std::allocator<discordpp::Component>_>_>::
  omittable_field(&local_318);
  omittable_field<std::vector<discordpp::StickerItem,_std::allocator<discordpp::StickerItem>_>_>::
  omittable_field(&local_338);
  omittable_field<std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>_>::
  omittable_field(&local_358);
  omittable_field<int>::omittable_field(&local_378);
  omittable_field<discordpp::RoleSubscriptionData>::omittable_field(&local_398);
  Message::Message(&this->super_Message,&local_28,&local_40,local_68,&local_80,&local_98,&local_b8,
                   &local_d0,&local_e8,&local_100,&local_118,&local_138,&local_150,&local_168,
                   &local_188,&local_1a8,&local_1c0,&local_1e0,&local_1f8,&local_218,&local_238,
                   &local_258,&local_278,&local_298,&local_2b8,&local_2d8,&local_2f8,&local_318,
                   &local_338,&local_358,&local_378,&local_398);
  omittable_field<discordpp::RoleSubscriptionData>::~omittable_field(&local_398);
  omittable_field<int>::~omittable_field(&local_378);
  omittable_field<std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>_>::
  ~omittable_field(&local_358);
  omittable_field<std::vector<discordpp::StickerItem,_std::allocator<discordpp::StickerItem>_>_>::
  ~omittable_field(&local_338);
  omittable_field<std::vector<discordpp::Component,_std::allocator<discordpp::Component>_>_>::
  ~omittable_field(&local_318);
  omittable_field<discordpp::Channel>::~omittable_field(&local_2f8);
  omittable_field<discordpp::MessageInteraction>::~omittable_field(&local_2d8);
  nullable_omittable_field<discordpp::Message>::~nullable_omittable_field(&local_2b8);
  omittable_field<int>::~omittable_field(&local_298);
  omittable_field<discordpp::MessageReference>::~omittable_field(&local_278);
  omittable_field<discordpp::Snowflake>::~omittable_field(&local_258);
  omittable_field<discordpp::Application>::~omittable_field(&local_238);
  omittable_field<discordpp::MessageActivity>::~omittable_field(&local_218);
  field<int>::~field(&local_1f8);
  omittable_field<discordpp::Snowflake>::~omittable_field(&local_1e0);
  field<bool>::~field(&local_1c0);
  omittable_field<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~omittable_field(&local_1a8);
  omittable_field<std::vector<discordpp::Reaction,_std::allocator<discordpp::Reaction>_>_>::
  ~omittable_field(&local_188);
  field<std::vector<discordpp::Embed,_std::allocator<discordpp::Embed>_>_>::~field(&local_168);
  field<std::vector<discordpp::Attachment,_std::allocator<discordpp::Attachment>_>_>::~field
            (&local_150);
  omittable_field<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_>
  ::~omittable_field(&local_138);
  field<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_>::~field
            (&local_118);
  field<std::vector<discordpp::User,_std::allocator<discordpp::User>_>_>::~field(&local_100);
  field<bool>::~field(&local_e8);
  field<bool>::~field(&local_d0);
  nullable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~nullable_field(&local_b8);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~field
            (&local_98);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~field
            (&local_80);
  field<discordpp::User>::~field(local_68);
  field<discordpp::Snowflake>::~field(&local_40);
  field<discordpp::Snowflake>::~field(&local_28);
  omittable_field<discordpp::Snowflake>::omittable_field(&this->guild_id);
  omittable_field<discordpp::GuildMember>::omittable_field(&this->member);
  discordpp::from_json(local_18,this);
  return;
}

Assistant:

MessageCreateEvent(const json &j) { from_json(j, *this); }